

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O3

void __thiscall
rest_rpc::rpc_service::rpc_server::publish<char_const*>
          (rpc_server *this,string *key,string *token,char *data)

{
  int iVar1;
  size_type sVar2;
  connection *this_00;
  _Atomic_word _Var3;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
  _Var4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  size_type *psVar7;
  bool bVar8;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_false,_true>_>
  pVar9;
  unique_lock<std::mutex> lock_1;
  unique_lock<std::mutex> lock;
  undefined1 local_e0 [32];
  string *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  string *local_a8;
  unique_lock<std::mutex> local_a0;
  _func_int **local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  error_code local_40;
  
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
  local_e0._0_8_ = &this->sub_mtx_;
  local_c0 = key;
  local_b0 = token;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_e0);
  local_e0[8] = 1;
  sVar2 = (this->sub_map_)._M_h._M_element_count;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_e0);
  if (sVar2 != 0) {
    std::__cxx11::string::string((string *)&local_90,data,(allocator *)local_e0);
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    local_b8->_M_use_count = 1;
    local_b8->_M_weak_count = 1;
    local_b8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164760;
    local_a8 = (string *)(local_b8 + 1);
    p_Var6 = local_b8 + 2;
    local_b8[1]._vptr__Sp_counted_base = (_func_int **)p_Var6;
    if (local_90 == (_func_int **)&local_80) {
      p_Var6->_vptr__Sp_counted_base = (_func_int **)CONCAT71(uStack_7f,local_80);
      local_b8[2]._M_use_count = (undefined4)uStack_78;
      local_b8[2]._M_weak_count = uStack_78._4_4_;
    }
    else {
      (local_a8->_M_dataplus)._M_p = (pointer)local_90;
      p_Var6->_vptr__Sp_counted_base = (_func_int **)CONCAT71(uStack_7f,local_80);
    }
    local_b8[1]._M_use_count = (undefined4)local_88;
    local_b8[1]._M_weak_count = local_88._4_4_;
    local_88 = 0;
    local_80 = 0;
    local_a0._M_owns = false;
    local_a0._M_device = &this->sub_mtx_;
    local_90 = (_func_int **)&local_80;
    std::unique_lock<std::mutex>::lock(&local_a0);
    local_a0._M_owns = true;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   local_c0,local_b0);
    pVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
            ::equal_range(&(this->sub_map_)._M_h,(key_type *)local_e0);
    _Var4._M_cur = (__node_type *)
                   pVar9.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                   ._M_cur;
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
         )_Var4._M_cur ==
        pVar9.second.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
        ._M_cur.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
       ) {
      if (asio::system_category()::instance == '\0') {
        publish<char_const*>();
      }
      std::operator+(&local_70,"The subscriber of the key: ",local_c0);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((mutex *)*plVar5 == (mutex *)psVar7) {
        local_e0._16_8_ = *psVar7;
        local_e0._24_8_ = plVar5[3];
        local_e0._0_8_ = (mutex *)(local_e0 + 0x10);
      }
      else {
        local_e0._16_8_ = *psVar7;
        local_e0._0_8_ = (mutex *)*plVar5;
      }
      local_e0._8_8_ = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((this->err_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_40._M_value = 0x16;
        local_40._M_cat = (error_category *)&asio::system_category()::instance;
        local_50.data_ = (const_pointer)local_e0._0_8_;
        local_50.size_ = local_e0._8_8_;
        (*(this->err_cb_)._M_invoker)((_Any_data *)&this->err_cb_,&local_40,&local_50);
      }
      if ((mutex *)local_e0._0_8_ != (mutex *)(local_e0 + 0x10)) {
        operator_delete((void *)local_e0._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
    }
    else {
      do {
        p_Var6 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&((_Var4._M_cur)->
                          super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                          ).
                          super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                          ._M_storage._M_storage + 0x28);
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var3 = p_Var6->_M_use_count;
          do {
            if (_Var3 == 0) goto LAB_00151cc2;
            LOCK();
            iVar1 = p_Var6->_M_use_count;
            bVar8 = _Var3 == iVar1;
            if (bVar8) {
              p_Var6->_M_use_count = _Var3 + 1;
              iVar1 = _Var3;
            }
            _Var3 = iVar1;
            UNLOCK();
          } while (!bVar8);
          if (((p_Var6->_M_use_count != 0) &&
              (this_00 = *(connection **)
                          ((long)&((_Var4._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>_>
                                  ._M_storage._M_storage + 0x20), this_00 != (connection *)0x0)) &&
             (this_00->has_closed_ == false)) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_e0,local_c0,local_b0);
            connection::publish(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_e0,local_a8);
            if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
              operator_delete((void *)local_e0._0_8_);
            }
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        }
LAB_00151cc2:
        _Var4._M_cur = (__node_type *)((_Var4._M_cur)->super__Hash_node_base)._M_nxt;
      } while ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
                )_Var4._M_cur !=
               pVar9.second.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
               ._M_cur.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>_>,_true>
              );
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_a0);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  return;
}

Assistant:

void publish(std::string key, std::string token, T data) {
    {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      if (sub_map_.empty())
        return;
    }

    std::shared_ptr<std::string> shared_data =
        get_shared_data<T>(std::move(data));
    std::unique_lock<std::mutex> lock(sub_mtx_);
    auto range = sub_map_.equal_range(key + token);
    if (range.first != range.second) {
      for (auto it = range.first; it != range.second; ++it) {
        auto conn = it->second.lock();
        if (conn == nullptr || conn->has_closed()) {
          continue;
        }

        conn->publish(key + token, *shared_data);
      }
    } else {
      error_callback(
          asio::error::make_error_code(asio::error::invalid_argument),
          "The subscriber of the key: " + key + " does not exist.");
    }
  }